

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O0

void __thiscall
CNetAddr::UnserializeV2Stream<ParamsStream<DataStream&,CNetAddr::SerParams>>
          (CNetAddr *this,ParamsStream<DataStream_&,_CNetAddr::SerParams> *s)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  string *psVar4;
  value_type_conflict3 *pvVar5;
  value_type_conflict3 *pvVar6;
  size_type sVar7;
  unsigned_long *in_RSI;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  size_t address_size;
  uint8_t bip155_net;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff54;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff58;
  array<unsigned_char,_12UL> *in_stack_ffffffffffffff70;
  size_type new_size;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff8c;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  uint8_t possible_bip155_net;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  size_t in_stack_ffffffffffffffb8;
  ulong local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar9 = in_RDI;
  ParamsStream<DataStream&,CNetAddr::SerParams>::operator>>
            ((ParamsStream<DataStream_&,_CNetAddr::SerParams> *)in_stack_ffffffffffffff58,
             (uchar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  possible_bip155_net = (uint8_t)((ulong)ppVar9 >> 0x38);
  Using<CompactSizeFormatter<true>,unsigned_long&>
            ((unsigned_long *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ParamsStream<DataStream&,CNetAddr::SerParams>::operator>>
            ((ParamsStream<DataStream_&,_CNetAddr::SerParams> *)in_stack_ffffffffffffff58,
             (Wrapper<CompactSizeFormatter<true>,_unsigned_long_&> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (0x200 < local_38) {
    uVar8 = CONCAT13(1,(int3)in_stack_ffffffffffffff88);
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_ffffffffffffff8c,uVar8),in_RSI,(unsigned_long *)in_RDI);
    std::ios_base::failure[abi:cxx11]::failure(psVar4);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(psVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_010c122e;
  }
  *(undefined4 *)((long)&in_RDI[1]._union + 4) = 0;
  bVar3 = SetNetFromBIP155Network
                    ((CNetAddr *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                     possible_bip155_net,in_stack_ffffffffffffffb8);
  if (bVar3) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::resize
              (in_RDI,(size_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    Span<unsigned_char>::Span<prevector<16u,unsigned_char,unsigned_int,int>>
              ((Span<unsigned_char> *)in_stack_ffffffffffffff58,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    ParamsStream<DataStream&,CNetAddr::SerParams>::operator>>
              ((ParamsStream<DataStream_&,_CNetAddr::SerParams> *)in_stack_ffffffffffffff58,
               (Span<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
    ;
    if (*(int *)&in_RDI[1]._union == 2) {
      bVar3 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,6ul>
                        (in_RDI,(array<unsigned_char,_6UL> *)in_stack_ffffffffffffff70);
      if (bVar3) {
        *(undefined4 *)&in_RDI[1]._union = 6;
        pvVar5 = prevector<16U,_unsigned_char,_unsigned_int,_int>::data(in_stack_ffffffffffffff48);
        new_size = (size_type)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        pvVar6 = prevector<16U,_unsigned_char,_unsigned_int,_int>::data(in_stack_ffffffffffffff48);
        sVar7 = std::array<unsigned_char,_6UL>::size
                          ((array<unsigned_char,_6UL> *)in_stack_ffffffffffffff48);
        uVar2 = *(undefined8 *)(pvVar6 + sVar7);
        *(undefined2 *)(pvVar5 + 8) = *(undefined2 *)(pvVar6 + sVar7 + 8);
        *(undefined8 *)pvVar5 = uVar2;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(in_RDI,new_size);
      }
      else {
        bVar3 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,12ul>
                          (in_RDI,in_stack_ffffffffffffff70);
        if ((bVar3) ||
           (bVar3 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,6ul>
                              (in_RDI,(array<unsigned_char,_6UL> *)in_stack_ffffffffffffff70), bVar3
           )) goto LAB_010c11c6;
      }
    }
  }
  else {
    ParamsStream<DataStream_&,_CNetAddr::SerParams>::ignore
              ((ParamsStream<DataStream_&,_CNetAddr::SerParams> *)in_stack_ffffffffffffff48,
               0x10c11c6);
LAB_010c11c6:
    *(undefined4 *)&in_RDI[1]._union = 2;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::assign
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
               (uchar *)in_stack_ffffffffffffff48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_010c122e:
  __stack_chk_fail();
}

Assistant:

void UnserializeV2Stream(Stream& s)
    {
        uint8_t bip155_net;
        s >> bip155_net;

        size_t address_size;
        s >> COMPACTSIZE(address_size);

        if (address_size > MAX_ADDRV2_SIZE) {
            throw std::ios_base::failure(strprintf(
                "Address too long: %u > %u", address_size, MAX_ADDRV2_SIZE));
        }

        m_scope_id = 0;

        if (SetNetFromBIP155Network(bip155_net, address_size)) {
            m_addr.resize(address_size);
            s >> Span{m_addr};

            if (m_net != NET_IPV6) {
                return;
            }

            // Do some special checks on IPv6 addresses.

            // Recognize NET_INTERNAL embedded in IPv6, such addresses are not
            // gossiped but could be coming from addrman, when unserializing from
            // disk.
            if (util::HasPrefix(m_addr, INTERNAL_IN_IPV6_PREFIX)) {
                m_net = NET_INTERNAL;
                memmove(m_addr.data(), m_addr.data() + INTERNAL_IN_IPV6_PREFIX.size(),
                        ADDR_INTERNAL_SIZE);
                m_addr.resize(ADDR_INTERNAL_SIZE);
                return;
            }

            if (!util::HasPrefix(m_addr, IPV4_IN_IPV6_PREFIX) &&
                !util::HasPrefix(m_addr, TORV2_IN_IPV6_PREFIX)) {
                return;
            }

            // IPv4 and TORv2 are not supposed to be embedded in IPv6 (like in V1
            // encoding). Unserialize as !IsValid(), thus ignoring them.
        } else {
            // If we receive an unknown BIP155 network id (from the future?) then
            // ignore the address - unserialize as !IsValid().
            s.ignore(address_size);
        }

        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
    }